

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O0

void resp0_cancel_recv(nni_aio *aio,void *arg,int rv)

{
  nni_mtx *mtx;
  resp0_sock *s;
  resp0_ctx *ctx;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  mtx = *arg;
  nni_mtx_lock(mtx);
  if (*(nni_aio **)((long)arg + 0x20) == aio) {
    nni_list_remove((nni_list *)&mtx[6].mtx.__data.__list.__next,arg);
    *(undefined8 *)((long)arg + 0x20) = 0;
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
resp0_cancel_recv(nni_aio *aio, void *arg, int rv)
{
	resp0_ctx  *ctx = arg;
	resp0_sock *s   = ctx->sock;

	nni_mtx_lock(&s->mtx);
	if (ctx->raio == aio) {
		nni_list_remove(&s->recvq, ctx);
		ctx->raio = NULL;
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&s->mtx);
}